

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::ListOptionParser::parseIntoConfig
          (ListOptionParser *this,Command *cmd,ConfigData *config)

{
  pointer pbVar1;
  What WVar2;
  bool bVar3;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  config->listSpec = TestNames;
  pbVar1 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((cmd->m_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar1);
    bVar3 = std::operator==(&local_40,"all");
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar3) {
      WVar2 = All;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_40,
                 (string *)
                 (cmd->m_args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      bVar3 = std::operator==(&local_40,"tests");
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar3) {
        WVar2 = Tests;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_40,
                   (string *)
                   (cmd->m_args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        bVar3 = std::operator==(&local_40,"reporters");
        std::__cxx11::string::~string((string *)&local_40);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"Expected [tests] or [reporters]",&local_41);
          Command::raiseError(cmd,&local_40);
        }
        WVar2 = Reports;
      }
    }
    config->listSpec = WVar2;
  }
  pbVar1 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(cmd->m_args).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    std::__cxx11::string::string((string *)&local_40,(string *)(pbVar1 + 1));
    bVar3 = std::operator==(&local_40,"xml");
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar3) {
      WVar2 = AsXml;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_40,
                 (string *)
                 ((cmd->m_args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      bVar3 = std::operator==(&local_40,"text");
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Expected [xml] or [text]",&local_41);
        Command::raiseError(cmd,&local_40);
      }
      WVar2 = AsText;
    }
    config->listSpec = config->listSpec | WVar2;
  }
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                config.listSpec = List::TestNames;
                if( cmd.argsCount() >= 1 ) {
                    if( cmd[0] == "all" )
                        config.listSpec = List::All;
                    else if( cmd[0] == "tests" )
                        config.listSpec = List::Tests;
                    else if( cmd[0] == "reporters" )
                        config.listSpec = List::Reports;
                    else
                        cmd.raiseError( "Expected [tests] or [reporters]" );
                }
                if( cmd.argsCount() >= 2 ) {
                    if( cmd[1] == "xml" )
                        config.listSpec = static_cast<List::What>( config.listSpec | List::AsXml );
                    else if( cmd[1] == "text" )
                        config.listSpec = static_cast<List::What>( config.listSpec | List::AsText );
                    else
                        cmd.raiseError( "Expected [xml] or [text]" );
                }
            }